

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O2

int quick_select_int(int *arr,int n)

{
  long lVar1;
  int t;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int t_2;
  int iVar6;
  int t_3;
  int t_1;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  
  iVar5 = (int)(n - 1U) / 2;
  iVar9 = 0;
  uVar8 = n - 1U;
  do {
    if ((int)uVar8 <= iVar9) {
LAB_001ed8f3:
      return arr[iVar5];
    }
    uVar4 = iVar9 + 1;
    uVar10 = (ulong)uVar4;
    if (uVar8 == uVar4) {
      iVar6 = arr[iVar9];
      if (arr[(int)uVar8] < iVar6) {
        arr[iVar9] = arr[(int)uVar8];
        arr[(int)uVar8] = iVar6;
      }
      goto LAB_001ed8f3;
    }
    iVar2 = (int)(iVar9 + uVar8) / 2;
    iVar6 = arr[iVar2];
    iVar7 = arr[(int)uVar8];
    if (iVar7 < iVar6) {
      arr[iVar2] = iVar7;
      arr[(int)uVar8] = iVar6;
      iVar7 = iVar6;
    }
    iVar6 = arr[iVar9];
    if (iVar7 < iVar6) {
      arr[iVar9] = iVar7;
      arr[(int)uVar8] = iVar6;
      iVar6 = arr[iVar9];
    }
    iVar7 = arr[iVar2];
    if (iVar6 < iVar7) {
      arr[iVar2] = iVar6;
      arr[iVar9] = iVar7;
      iVar7 = arr[iVar2];
    }
    arr[iVar2] = arr[(int)uVar4];
    arr[(int)uVar4] = iVar7;
    uVar4 = uVar8;
    while( true ) {
      iVar6 = arr[iVar9];
      uVar10 = (ulong)(int)uVar10;
      do {
        iVar7 = arr[uVar10 + 1];
        uVar10 = uVar10 + 1;
      } while (iVar7 < iVar6);
      lVar1 = (long)(int)uVar4 + 1;
      do {
        uVar3 = uVar4;
        lVar11 = lVar1;
        iVar2 = arr[lVar11 + -2];
        uVar4 = uVar3 - 1;
        lVar1 = lVar11 + -1;
      } while (iVar6 < iVar2);
      if (lVar11 + -1 <= (long)uVar10) break;
      arr[uVar10] = iVar2;
      arr[lVar11 + -2] = iVar7;
    }
    arr[iVar9] = iVar2;
    arr[lVar11 + -2] = iVar6;
    if ((int)uVar4 <= iVar5) {
      iVar9 = (int)uVar10;
    }
    if (iVar5 < (int)uVar3) {
      uVar8 = uVar3 - 2;
    }
  } while( true );
}

Assistant:

static int quick_select_int(int arr[], int n) 
{
    int low, high ;
    int median;
    int middle, ll, hh;

    low = 0 ; high = n-1 ; median = (low + high) / 2;
    for (;;) {
        if (high <= low) /* One element only */
            return arr[median] ;

        if (high == low + 1) {  /* Two elements only */
            if (arr[low] > arr[high])
                ELEM_SWAP(arr[low], arr[high]) ;
            return arr[median] ;
        }

    /* Find median of low, middle and high items; swap into position low */
    middle = (low + high) / 2;
    if (arr[middle] > arr[high])    ELEM_SWAP(arr[middle], arr[high]) ;
    if (arr[low] > arr[high])       ELEM_SWAP(arr[low], arr[high]) ;
    if (arr[middle] > arr[low])     ELEM_SWAP(arr[middle], arr[low]) ;

    /* Swap low item (now in position middle) into position (low+1) */
    ELEM_SWAP(arr[middle], arr[low+1]) ;

    /* Nibble from each end towards middle, swapping items when stuck */
    ll = low + 1;
    hh = high;
    for (;;) {
        do ll++; while (arr[low] > arr[ll]) ;
        do hh--; while (arr[hh]  > arr[low]) ;

        if (hh < ll)
        break;

        ELEM_SWAP(arr[ll], arr[hh]) ;
    }

    /* Swap middle item (in position low) back into correct position */
    ELEM_SWAP(arr[low], arr[hh]) ;

    /* Re-set active partition */
    if (hh <= median)
        low = ll;
        if (hh >= median)
        high = hh - 1;
    }
}